

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O3

void spell_corrode_lock(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  short sVar1;
  EXIT_DATA *pEVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  OBJ_DATA *arg1;
  ulong uVar7;
  char *txt;
  char arg [4608];
  char local_1228 [4608];
  
  target_name = one_argument(target_name,local_1228);
  if (local_1228[0] == '\0') {
    txt = "What are you trying to corrode?\n\r";
    goto LAB_00310019;
  }
  iVar4 = number_percent();
  iVar5 = get_skill(ch,(int)gsn_corrode_lock);
  if (iVar5 < iVar4) {
    send_to_char("Your acid touch has no effect on the lock.\n\r",ch);
    bVar3 = false;
    sVar1 = gsn_pick_lock;
    goto LAB_00310006;
  }
  arg1 = get_obj_here(ch,local_1228);
  if (arg1 == (OBJ_DATA *)0x0) {
    uVar6 = find_door(ch,local_1228);
    if ((int)uVar6 < 0) {
      return;
    }
    pEVar2 = ch->in_room->exit[uVar6];
    if (((pEVar2->exit_info[0] & 2) != 0) || (bVar3 = is_immortal(ch), bVar3)) {
      if ((pEVar2->key < 0) && (bVar3 = is_immortal(ch), !bVar3)) {
        txt = "It can\'t be corroded.\n\r";
        goto LAB_00310019;
      }
      uVar7 = pEVar2->exit_info[0];
      if ((uVar7 & 4) != 0) {
        if ((uVar7 & 8) == 0) {
LAB_003100ea:
          pEVar2->exit_info[0] = uVar7 & 0xfffffffffffffffb;
          send_to_char("You corrode the lock on the door.\n\r",ch);
          act("$n corrodes the lock on $T.",ch,(void *)0x0,pEVar2->keyword,0);
          check_improve(ch,(int)gsn_corrode_lock,true,2);
          if ((pEVar2->u1).to_room == (ROOM_INDEX_DATA *)0x0) {
            return;
          }
          pEVar2 = ((pEVar2->u1).to_room)->exit[rev_dir[uVar6]];
          if (pEVar2 == (EXIT_DATA *)0x0) {
            return;
          }
          if ((pEVar2->u1).to_room != ch->in_room) {
            return;
          }
          *(byte *)pEVar2->exit_info = (byte)pEVar2->exit_info[0] & 0xfb;
          return;
        }
        bVar3 = is_immortal(ch);
        if (bVar3) {
          uVar7 = pEVar2->exit_info[0];
          goto LAB_003100ea;
        }
LAB_0031022d:
        txt = "You failed.\n\r";
        goto LAB_00310019;
      }
LAB_0031018a:
      txt = "It\'s already unlocked.\n\r";
      goto LAB_00310019;
    }
  }
  else if (arg1->item_type == 0xf) {
    uVar6 = arg1->value[1];
    if ((uVar6 & 4) != 0) {
      if (arg1->value[2] < 0) {
LAB_003101c5:
        txt = "It can not be melted.\n\r";
        goto LAB_00310019;
      }
      if ((uVar6 & 8) != 0) {
        if ((uVar6 & 2) != 0) goto LAB_0031022d;
        uVar6 = uVar6 & 0xfffffff7;
LAB_003101e4:
        arg1->value[1] = uVar6;
        act("You touch $p with an acid coated hand and corrode the lock.",ch,arg1,(void *)0x0,3);
        act("$n corrodes the lock on $p with his acid touch.",ch,arg1,(void *)0x0,0);
        bVar3 = true;
        sVar1 = gsn_corrode_lock;
LAB_00310006:
        check_improve(ch,(int)sVar1,bVar3,2);
        return;
      }
      goto LAB_0031018a;
    }
  }
  else {
    if (arg1->item_type != 0x1d) {
      txt = "That\'s not a container.\n\r";
      goto LAB_00310019;
    }
    uVar6 = arg1->value[1];
    if ((uVar6 & 1) == 0) {
      txt = "You can\'t do that.\n\r";
      goto LAB_00310019;
    }
    if ((uVar6 & 2) != 0) {
      if (-1 < arg1->value[4]) {
        if ((uVar6 & 8) != 0) goto LAB_0031022d;
        uVar6 = uVar6 & 0xfffffffb;
        goto LAB_003101e4;
      }
      goto LAB_003101c5;
    }
  }
  txt = "It\'s not closed.\n\r";
LAB_00310019:
  send_to_char(txt,ch);
  return;
}

Assistant:

void spell_corrode_lock(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	char arg[MAX_INPUT_LENGTH];
	OBJ_DATA *obj;
	int door;

	target_name = one_argument(target_name, arg);

	if (arg[0] == '\0')
	{
		send_to_char("What are you trying to corrode?\n\r", ch);
		return;
	}

	if (number_percent() > get_skill(ch, gsn_corrode_lock))
	{
		send_to_char("Your acid touch has no effect on the lock.\n\r", ch);
		check_improve(ch, gsn_pick_lock, false, 2);
		return;
	}
	else
	{
		obj = get_obj_here(ch, arg);

		if (obj != nullptr)
		{
			if (obj->item_type == ITEM_PORTAL)
			{
				if (!IS_SET_OLD(obj->value[1], EX_ISDOOR))
				{
					send_to_char("You can't do that.\n\r", ch);
					return;
				}

				if (!IS_SET_OLD(obj->value[1], EX_CLOSED))
				{
					send_to_char("It's not closed.\n\r", ch);
					return;
				}

				if (obj->value[4] < 0)
				{
					send_to_char("It can not be melted.\n\r", ch);
					return;
				}

				if (IS_SET_OLD(obj->value[1], EX_PICKPROOF))
				{
					send_to_char("You failed.\n\r", ch);
					return;
				}

				REMOVE_BIT_OLD(obj->value[1], EX_LOCKED);
			}
			else
			{
				if (obj->item_type != ITEM_CONTAINER)
				{
					send_to_char("That's not a container.\n\r", ch);
					return;
				}

				if (!IS_SET_OLD(obj->value[1], CONT_CLOSED))
				{
					send_to_char("It's not closed.\n\r", ch);
					return;
				}

				if (obj->value[2] < 0)
				{
					send_to_char("It can not be melted.\n\r", ch);
					return;
				}

				if (!IS_SET_OLD(obj->value[1], CONT_LOCKED))
				{
					send_to_char("It's already unlocked.\n\r", ch);
					return;
				}

				if (IS_SET_OLD(obj->value[1], CONT_PICKPROOF))
				{
					send_to_char("You failed.\n\r", ch);
					return;
				}

				REMOVE_BIT_OLD(obj->value[1], CONT_LOCKED);
			}

			act("You touch $p with an acid coated hand and corrode the lock.", ch, obj, nullptr, TO_CHAR);
			act("$n corrodes the lock on $p with his acid touch.", ch, obj, nullptr, TO_ROOM);

			check_improve(ch, gsn_corrode_lock, true, 2);
			return;
		}
		else if ((door = find_door(ch, arg)) >= 0)
		{
			ROOM_INDEX_DATA *to_room;
			EXIT_DATA *pexit;
			EXIT_DATA *pexit_rev;

			pexit = ch->in_room->exit[door];

			if (!IS_SET(pexit->exit_info, EX_CLOSED) && !is_immortal(ch))
			{
				send_to_char("It's not closed.\n\r", ch);
				return;
			}

			if (pexit->key < 0 && !is_immortal(ch))
			{
				send_to_char("It can't be corroded.\n\r", ch);
				return;
			}

			if (!IS_SET(pexit->exit_info, EX_LOCKED))
			{
				send_to_char("It's already unlocked.\n\r", ch);
				return;
			}

			if (IS_SET(pexit->exit_info, EX_PICKPROOF) && !is_immortal(ch))
			{
				send_to_char("You failed.\n\r", ch);
				return;
			}

			REMOVE_BIT(pexit->exit_info, EX_LOCKED);

			send_to_char("You corrode the lock on the door.\n\r", ch);
			act("$n corrodes the lock on $T.", ch, nullptr, pexit->keyword, TO_ROOM);

			check_improve(ch, gsn_corrode_lock, true, 2);

			if ((to_room = pexit->u1.to_room) != nullptr
				&& (pexit_rev = to_room->exit[rev_dir[door]]) != nullptr
				&& pexit_rev->u1.to_room == ch->in_room)
			{
				REMOVE_BIT(pexit_rev->exit_info, EX_LOCKED);
			}
		}
	}
}